

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint32 ma_dr_mp3_decode_next_frame_ex(ma_dr_mp3 *pMP3,ma_dr_mp3d_sample_t *pPCMFrames)

{
  long in_RDI;
  ma_dr_mp3d_sample_t *in_stack_00000030;
  ma_dr_mp3 *in_stack_00000038;
  undefined4 local_4;
  
  if ((*(long *)(in_RDI + 0x3ea8) == 0) || (*(long *)(in_RDI + 0x3eb0) == 0)) {
    local_4 = ma_dr_mp3_decode_next_frame_ex__callbacks(in_stack_00000038,in_stack_00000030);
  }
  else {
    local_4 = ma_dr_mp3_decode_next_frame_ex__memory(pMP3,pPCMFrames);
  }
  return local_4;
}

Assistant:

static ma_uint32 ma_dr_mp3_decode_next_frame_ex(ma_dr_mp3* pMP3, ma_dr_mp3d_sample_t* pPCMFrames)
{
    if (pMP3->memory.pData != NULL && pMP3->memory.dataSize > 0) {
        return ma_dr_mp3_decode_next_frame_ex__memory(pMP3, pPCMFrames);
    } else {
        return ma_dr_mp3_decode_next_frame_ex__callbacks(pMP3, pPCMFrames);
    }
}